

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_netstd_struct_hashcode
          (t_netstd_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_type *ptVar2;
  int iVar3;
  ostream *poVar4;
  pointer pptVar5;
  string local_50;
  
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,"public override int GetHashCode() {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,"int hashcode = 157;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,"unchecked {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  for (pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar5 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    ptVar2 = (*pptVar5)->type_;
    generate_null_check_begin(this,out,*pptVar5);
    t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_50);
    std::operator<<(poVar4,"hashcode = (hashcode * 397) + ");
    std::__cxx11::string::~string((string *)&local_50);
    iVar3 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xd])(ptVar2);
    if ((char)iVar3 == '\0') {
      prop_name_abi_cxx11_(&local_50,this,*pptVar5,false);
      poVar4 = std::operator<<(out,(string *)&local_50);
      std::operator<<(poVar4,".GetHashCode()");
    }
    else {
      poVar4 = std::operator<<(out,"TCollections.GetHashCode(");
      prop_name_abi_cxx11_(&local_50,this,*pptVar5,false);
      poVar4 = std::operator<<(poVar4,(string *)&local_50);
      std::operator<<(poVar4,")");
    }
    std::__cxx11::string::~string((string *)&local_50);
    poVar4 = std::operator<<(out,";");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    generate_null_check_end(this,out,*pptVar5);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,"return hashcode;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_hashcode(ostream& out, t_struct* tstruct)
{
    out << indent() << "public override int GetHashCode() {" << endl;
    indent_up();

    out << indent() << "int hashcode = 157;" << endl;
    out << indent() << "unchecked {" << endl;
    indent_up();

    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        t_type* ttype = (*f_iter)->get_type();

        generate_null_check_begin(out, *f_iter);
        out << indent() << "hashcode = (hashcode * 397) + ";
        if (ttype->is_container()) {
            out << "TCollections.GetHashCode(" << prop_name((*f_iter)) << ")";
        }
        else {
            out << prop_name((*f_iter)) << ".GetHashCode()";
        }
        out << ";" << endl;

        generate_null_check_end(out, *f_iter);
    }

    indent_down();
    out << indent() << "}" << endl;
    out << indent() << "return hashcode;" << endl;

    indent_down();
    out << indent() << "}" << endl << endl;
}